

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::
ParserRefImpl<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>
          (ParserRefImpl<Catch::clara::detail::Opt> *this,anon_class_8_1_50637480_for_m_lambda *ref,
          string *hint)

{
  string *in_RDX;
  undefined8 *in_RDI;
  shared_ptr<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2_include_catch2_catch_2_13_10_hpp:9722:44)>_>
  *in_stack_ffffffffffffffa8;
  ComposableParserImpl<Catch::clara::detail::Opt> *in_stack_ffffffffffffffb0;
  element_type *in_stack_ffffffffffffffd8;
  
  ComposableParserImpl<Catch::clara::detail::Opt>::ComposableParserImpl(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__ParserRefImpl_0027a268;
  *(undefined4 *)(in_RDI + 1) = 0;
  ::std::
  make_shared<Catch::clara::detail::BoundLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>,Catch::makeCommandLineParser(Catch::ConfigData&)::__5_const&>
            ((anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffffd8);
  ::std::shared_ptr<Catch::clara::detail::BoundRef>::
  shared_ptr<Catch::clara::detail::BoundLambda<Catch::makeCommandLineParser(Catch::ConfigData&)::__5>,void>
            ((shared_ptr<Catch::clara::detail::BoundRef> *)&stack0xffffffffffffffd8,
             in_stack_ffffffffffffffa8);
  std::
  shared_ptr<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2/include/catch2/catch.2.13.10.hpp:9722:44)>_>
  ::~shared_ptr((shared_ptr<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2_include_catch2_catch_2_13_10_hpp:9722:44)>_>
                 *)0x149eb0);
  ::std::__cxx11::string::string((string *)(in_RDI + 4),in_RDX);
  ::std::__cxx11::string::string((string *)(in_RDI + 8));
  return;
}

Assistant:

ParserRefImpl( LambdaT const &ref, std::string const &hint )
        :   m_ref( std::make_shared<BoundLambda<LambdaT>>( ref ) ),
            m_hint(hint)
        {}